

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O3

Texture * rw::Texture::streamReadNative(Stream *stream)

{
  bool bVar1;
  uint32 uVar2;
  Texture *pTVar3;
  
  bVar1 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar1) {
    uVar2 = Stream::readU32(stream);
    (*stream->_vptr_Stream[5])(stream,0xfffffff0,1);
    switch(uVar2) {
    case 5:
      pTVar3 = xbox::readNativeTexture(stream);
      return pTVar3;
    case 6:
    case 7:
    case 10:
    case 0xb:
      break;
    case 8:
      pTVar3 = d3d8::readNativeTexture(stream);
      return pTVar3;
    case 9:
      pTVar3 = d3d9::readNativeTexture(stream);
      return pTVar3;
    case 0xc:
      pTVar3 = gl3::readNativeTexture(stream);
      return pTVar3;
    default:
      if (uVar2 == 0x325350) {
        pTVar3 = ps2::readNativeTexture(stream);
        return pTVar3;
      }
    }
  }
  else {
    streamReadNative();
  }
  return (Texture *)0x0;
}

Assistant:

Texture*
Texture::streamReadNative(Stream *stream)
{
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	uint32 platform = stream->readU32();
	stream->seek(-16);
	if(platform == FOURCC_PS2)
		return ps2::readNativeTexture(stream);
	if(platform == PLATFORM_D3D8)
		return d3d8::readNativeTexture(stream);
	if(platform == PLATFORM_D3D9)
		return d3d9::readNativeTexture(stream);
	if(platform == PLATFORM_XBOX)
		return xbox::readNativeTexture(stream);
	if(platform == PLATFORM_GL3)
		return gl3::readNativeTexture(stream);
	assert(0 && "unsupported platform");
	return nil;
}